

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-ipc.c
# Opt level: O2

void on_tcp_read(uv_stream_t *tcp,ssize_t nread,uv_buf_t *buf)

{
  int iVar1;
  undefined8 uVar2;
  char *pcVar3;
  
  if (nread < 1) {
    pcVar3 = "nread > 0";
    uVar2 = 0x15a;
  }
  else {
    pcVar3 = buf->base;
    iVar1 = bcmp("hello again\n",pcVar3,nread);
    if (iVar1 == 0) {
      if (tcp == (uv_stream_t *)&tcp_connection) {
        free(pcVar3);
        tcp_read_cb_called = tcp_read_cb_called + 1;
        uv_close((uv_handle_t *)&tcp_connection,(uv_close_cb)0x0);
        uv_close((uv_handle_t *)&channel,(uv_close_cb)0x0);
        return;
      }
      pcVar3 = "tcp == (uv_stream_t*)&tcp_connection";
      uVar2 = 0x15c;
    }
    else {
      pcVar3 = "memcmp(\"hello again\\n\", buf->base, nread) == 0";
      uVar2 = 0x15b;
    }
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-ipc.c"
          ,uVar2,pcVar3);
  abort();
}

Assistant:

static void on_tcp_read(uv_stream_t* tcp, ssize_t nread, const uv_buf_t* buf) {
  ASSERT(nread > 0);
  ASSERT(memcmp("hello again\n", buf->base, nread) == 0);
  ASSERT(tcp == (uv_stream_t*)&tcp_connection);
  free(buf->base);

  tcp_read_cb_called++;

  uv_close((uv_handle_t*)tcp, NULL);
  uv_close((uv_handle_t*)&channel, NULL);
}